

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::only_success_left
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,size_type pos)

{
  bool bVar1;
  const_reference prVar2;
  state_type *state;
  size_type pos_local;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  state = (state_type *)pos;
  do {
    prVar2 = simple_array<srell::regex_internal::re_state>::operator[]
                       ((simple_array<srell::regex_internal::re_state> *)this,(size_type)state);
    switch(prVar2->type) {
    case st_epsilon:
      if (((prVar2->field_3).next2 != 0) &&
         (bVar1 = only_success_left(this,(long)&((prVar2->field_3).next_state2)->field_0 +
                                         (long)&state->field_0), !bVar1)) {
        return false;
      }
      break;
    default:
      return false;
    case st_roundbracket_open:
      break;
    case st_roundbracket_close:
    case st_backreference:
      if (((prVar2->field_3).next2 != 0) && ((prVar2->field_2).next1 != (prVar2->field_3).next2)) {
        return false;
      }
      break;
    case st_lookaround_close:
      return true;
    }
    if ((prVar2->field_2).next1 == 0) {
      return false;
    }
    state = (state_type *)((long)&state->field_0 + (long)&((prVar2->field_2).next_state1)->field_0);
  } while( true );
}

Assistant:

bool only_success_left(typename state_array::size_type pos) const
	{
		for (;;)
		{
			const state_type &state = this->NFA_states[pos];

			switch (state.type)
			{
			case st_success:
				return true;

			case st_roundbracket_close:
			case st_backreference:
				if (state.next2 != 0 && state.next1 != state.next2)
					return false;
				break;

			case st_epsilon:
				if (state.next2 != 0 && !only_success_left(pos + state.next2))
					return false;
				break;

			case st_roundbracket_open:
				break;	//  /a*()/

			default:
				return false;
			}
			if (state.next1)
				pos += state.next1;
			else
				return false;
		}
	}